

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

char16 * Js::JavascriptObject::ConstructName
                   (PropertyRecord *propertyRecord,char16 *getOrSetStr,ScriptContext *scriptContext)

{
  ulong uVar1;
  short sVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *this;
  char16 *pcVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x829,"(propertyRecord)","propertyRecord");
    if (!bVar4) goto LAB_00cf581b;
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x82a,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00cf581b;
    *puVar6 = 0;
  }
  if (propertyRecord->byteCount < 2) {
    return (char16 *)0x0;
  }
  uVar13 = propertyRecord->byteCount >> 1;
  uVar1 = (ulong)uVar13 + 5;
  local_60 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7b17b92;
  data.filename._0_4_ = 0x832;
  data.plusSize = uVar1;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    data._32_8_ = __tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)data._32_8_ = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00cf581b;
    *(undefined4 *)data._32_8_ = 0;
  }
  pcVar7 = (char16 *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                     (this,(ulong)uVar13 * 2 + 10);
  if (pcVar7 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    data._32_8_ = __tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)data._32_8_ = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00cf581b;
    *(undefined4 *)data._32_8_ = 0;
  }
  if (pcVar7 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    data._32_8_ = __tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)data._32_8_ = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x833,"(finalName != nullptr)","finalName != nullptr");
    if (!bVar4) goto LAB_00cf581b;
    *(undefined4 *)data._32_8_ = 0;
LAB_00cf56bf:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    lVar11 = 0;
    uVar8 = uVar1;
    do {
      sVar2 = *(short *)((long)&propertyRecord[1].super_FinalizableObject.
                                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar11);
      *(short *)((long)pcVar7 + lVar11) = sVar2;
      if (sVar2 == 0) goto LAB_00cf567a;
      lVar11 = lVar11 + 2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    uVar8 = 0;
LAB_00cf567a:
    if (uVar8 == 0) {
      *pcVar7 = L'\0';
      memset(pcVar7 + 1,0xfd,uVar1 * 2 - 2);
      goto LAB_00cf56bf;
    }
    uVar8 = (uVar1 - uVar8) + 1;
    if (uVar8 <= uVar1 && uVar1 - uVar8 != 0) {
      memset(pcVar7 + uVar8,0xfd,(uVar1 - uVar8) * 2);
    }
  }
  if (getOrSetStr == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x838,"(getOrSetStr != nullptr)","getOrSetStr != nullptr");
    if (!bVar4) goto LAB_00cf581b;
    *puVar6 = 0;
  }
  sVar9 = PAL_wcslen(getOrSetStr);
  if (sVar9 != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x839,"(PAL_wcslen(getOrSetStr) == 4)","wcslen(getOrSetStr) == 4");
    if (!bVar4) {
LAB_00cf581b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pcVar10 = (char *)((long)pcVar7 + (ulong)(uVar13 * 2));
  if (pcVar10 != (char *)0x0) {
    if (getOrSetStr != (char16 *)0x0) {
      lVar11 = 5;
      lVar12 = 0;
      do {
        sVar2 = *(short *)((long)getOrSetStr + lVar12);
        *(short *)(pcVar10 + lVar12) = sVar2;
        if (sVar2 == 0) goto LAB_00cf57bb;
        lVar12 = lVar12 + 2;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar11 = 0;
LAB_00cf57bb:
      if (lVar11 != 0) {
        if (4 < 6U - lVar11) {
          return pcVar7;
        }
        memset(pcVar10 + (6U - lVar11) * 2,0xfd,lVar11 * 2 - 2);
        return pcVar7;
      }
    }
    pcVar10[0] = '\0';
    pcVar10[1] = '\0';
    pcVar10[2] = -3;
    pcVar10[3] = -3;
    pcVar10[4] = -3;
    pcVar10[5] = -3;
    pcVar10[6] = -3;
    pcVar10[7] = -3;
    pcVar10[8] = -3;
    pcVar10[9] = -3;
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return pcVar7;
}

Assistant:

char16 * JavascriptObject::ConstructName(const PropertyRecord * propertyRecord, const char16 * getOrSetStr, ScriptContext* scriptContext)
{
    Assert(propertyRecord);
    Assert(scriptContext);
    char16 * finalName = nullptr;
    size_t propertyLength = (size_t)propertyRecord->GetLength();
    if (propertyLength > 0)
    {
        size_t totalChars;
        if (SizeTAdd(propertyLength, ConstructNameGetSetLength, &totalChars) == S_OK)
        {
            finalName = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), char16, totalChars);
            Assert(finalName != nullptr);
            const char16* propertyName = propertyRecord->GetBuffer();
            Assert(propertyName != nullptr);
            wcscpy_s(finalName, totalChars, propertyName);

            Assert(getOrSetStr != nullptr);
            Assert(wcslen(getOrSetStr) == 4);

            wcscpy_s(finalName + propertyLength, ConstructNameGetSetLength, getOrSetStr);
        }
    }
    return finalName;
}